

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_jcc1_noeob(DisasContext *s,int b,TCGLabel *l1)

{
  TCGContext *tcg_ctx;
  CCPrepare cc;
  CCPrepare local_50;
  
  tcg_ctx = s->uc->tcg_ctx;
  gen_prepare_cc(&local_50,s,b,s->T0);
  if (local_50.mask != 0xffffffffffffffff) {
    tcg_gen_andi_i64_x86_64(tcg_ctx,s->T0,local_50.reg,local_50.mask);
    local_50.reg = s->T0;
  }
  if (local_50.use_reg2 == true) {
    tcg_gen_brcond_i64_x86_64(tcg_ctx,local_50.cond,local_50.reg,local_50.reg2,l1);
    return;
  }
  tcg_gen_brcondi_i64_x86_64(tcg_ctx,local_50.cond,local_50.reg,local_50.imm,l1);
  return;
}

Assistant:

static inline void gen_jcc1_noeob(DisasContext *s, int b, TCGLabel *l1)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    CCPrepare cc = gen_prepare_cc(s, b, s->T0);

    if (cc.mask != -1) {
        tcg_gen_andi_tl(tcg_ctx, s->T0, cc.reg, cc.mask);
        cc.reg = s->T0;
    }
    if (cc.use_reg2) {
        tcg_gen_brcond_tl(tcg_ctx, cc.cond, cc.reg, cc.reg2, l1);
    } else {
        tcg_gen_brcondi_tl(tcg_ctx, cc.cond, cc.reg, cc.imm, l1);
    }
}